

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall CVmImageLoader::load_resource_file(CVmImageLoader *this,CVmImageLoaderMres *res_ifc)

{
  bool bVar1;
  undefined2 uVar2;
  int iVar3;
  ulong siz;
  char buf [128];
  
  read_image_header(this);
  bVar1 = false;
  do {
    do {
      if (bVar1) {
        return;
      }
      (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,buf,10);
      uVar2 = buf._8_2_;
      siz = (ulong)(uint)buf._4_4_;
      iVar3 = block_type_is(buf,"EOF ");
      bVar1 = true;
    } while (iVar3 != 0);
    iVar3 = block_type_is(buf,"MRES");
    if (iVar3 == 0) {
      iVar3 = block_type_is(buf,"MREL");
      if (iVar3 == 0) {
        if ((uVar2 & 1) != 0) {
          err_throw_a(0x131,1,8);
        }
        (*this->fp_->_vptr_CVmImageFile[9])(this->fp_,siz);
      }
      else {
        load_mres_link(this,siz,res_ifc);
      }
    }
    else {
      load_mres(this,siz,res_ifc);
    }
    bVar1 = false;
  } while( true );
}

Assistant:

void CVmImageLoader::load_resource_file(CVmImageLoaderMres *res_ifc)
{
    int done;

    /* read and validate the image header */
    read_image_header();

    /* load the blocks */
    for (done = FALSE ; !done ; )
    {
        ulong siz;
        uint flags;
        char buf[128];

        /* read the next data block header */
        fp_->copy_data(buf, 10);

        /* get the size */
        siz = t3rp4u(buf + 4);

        /* get the flags */
        flags = osrp2(buf + 8);

        /* check the block type */
        if (block_type_is(buf, "EOF "))
        {
            /* we're done */
            done = TRUE;
        }
        else if (block_type_is(buf, "MRES"))
        {
            /* load the multimedia resource block */
            load_mres(siz, res_ifc);
        }
        else if (block_type_is(buf, "MREL"))
        {
            /* load the multimedia resource link block */
            load_mres_link(siz, res_ifc);
        }
        else
        {
            /* 
             *   Unknown block type - ignore it, unless it's mandatory, in
             *   which case this is an error.  This is a version-related
             *   error (fixable by updating to the latest version), so set
             *   the version flag in the exception, if we throw one.  
             */
            if ((flags & VMIMAGE_DBF_MANDATORY) != 0)
                err_throw_a(VMERR_UNKNOWN_IMAGE_BLOCK, 1,
                            ERR_TYPE_VERSION_FLAG);

            /* skip past the block */
            fp_->skip_ahead(siz);
        }
    }
}